

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMiniSDF.cpp
# Opt level: O1

bool __thiscall
cbtMiniSDF::interpolate
          (cbtMiniSDF *this,uint field_id,double *dist,cbtVector3 *x,cbtVector3 *gradient)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  cbtCell32 *pcVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  bool bVar19;
  uint uVar20;
  uint uVar21;
  cbtScalar *pcVar22;
  uint uVar23;
  ulong uVar24;
  cbtMiniSDF *this_00;
  uint uVar25;
  long lVar26;
  bool bVar27;
  double dVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM10 [64];
  float fVar38;
  undefined1 in_ZMM12 [64];
  float fVar39;
  float fVar40;
  undefined8 in_XMM15_Qb;
  cbtVector3 xi;
  cbtShapeMatrix N;
  cbtShapeGradients dN;
  cbtVector3 local_338;
  cbtShapeMatrix local_328;
  cbtShapeGradients local_228;
  
  if (this->m_isValid == true) {
    fVar1 = (this->m_domain).m_min.m_floats[1];
    fVar2 = x->m_floats[1];
    bVar19 = false;
    bVar27 = false;
    if ((fVar1 <= fVar2) && (fVar2 <= (this->m_domain).m_max.m_floats[1])) {
      fVar3 = (this->m_domain).m_min.m_floats[2];
      fVar4 = x->m_floats[2];
      bVar27 = bVar19;
      if ((fVar3 <= fVar4) && (fVar4 <= (this->m_domain).m_max.m_floats[2])) {
        fVar5 = (this->m_domain).m_min.m_floats[0];
        fVar6 = x->m_floats[0];
        if ((fVar5 <= fVar6) && (fVar6 <= (this->m_domain).m_max.m_floats[0])) {
          uVar20 = vcvttss2usi_avx512f(ZEXT416((uint)((fVar6 - fVar5) *
                                                     (this->m_inv_cell_size).m_floats[0])));
          uVar23 = vcvttss2usi_avx512f(ZEXT416((uint)((fVar2 - fVar1) *
                                                     (this->m_inv_cell_size).m_floats[1])));
          uVar25 = vcvttss2usi_avx512f(ZEXT416((uint)((fVar4 - fVar3) *
                                                     (this->m_inv_cell_size).m_floats[2])));
          uVar12 = this->m_resolution[0];
          uVar13 = this->m_resolution[1];
          uVar21 = uVar12 - 1;
          if (uVar20 < uVar12) {
            uVar21 = uVar20;
          }
          uVar20 = uVar13 - 1;
          if (uVar23 < uVar13) {
            uVar20 = uVar23;
          }
          uVar23 = this->m_resolution[2] - 1;
          if (uVar25 < this->m_resolution[2]) {
            uVar23 = uVar25;
          }
          uVar21 = (uVar23 * uVar13 + uVar20) * uVar12 + uVar21;
          this_00 = (cbtMiniSDF *)(long)(int)uVar21;
          lVar26 = (long)(int)(this->m_cell_map).m_data[(int)field_id].m_data[(long)this_00];
          if (lVar26 == -1) {
            bVar27 = false;
          }
          else {
            uVar24 = (ulong)uVar21 % (ulong)(uVar13 * uVar12);
            fVar7 = (this->m_cell_size).m_floats[0];
            fVar8 = (this->m_cell_size).m_floats[1];
            auVar30 = vcvtusi2sd_avx512f(in_ZMM9._0_16_,(int)(uVar24 % (ulong)uVar12));
            auVar18 = vcvtusi2sd_avx512f(in_ZMM10._0_16_,(int)(uVar24 / uVar12));
            fVar9 = (this->m_cell_size).m_floats[2];
            auVar31 = vcvtusi2sd_avx512f(in_ZMM12._0_16_,uVar21 / (uVar13 * uVar12));
            fVar5 = (float)(auVar30._0_8_ * (double)fVar7) + fVar5;
            fVar1 = (float)(auVar18._0_8_ * (double)fVar8) + fVar1;
            fVar3 = (float)(auVar31._0_8_ * (double)fVar9) + fVar3;
            fVar7 = fVar7 + fVar5;
            fVar8 = fVar8 + fVar1;
            fVar9 = fVar9 + fVar3;
            fVar15 = fVar7 - fVar5;
            fVar16 = fVar8 - fVar1;
            fVar17 = fVar9 - fVar3;
            fVar40 = 2.0 / fVar15;
            fVar39 = 2.0 / fVar16;
            fVar38 = 2.0 / fVar17;
            auVar30 = vinsertps_avx(ZEXT416((uint)(fVar40 * fVar6 - (fVar5 + fVar7) / fVar15)),
                                    ZEXT416((uint)(fVar39 * fVar2 - (fVar1 + fVar8) / fVar16)),0x10)
            ;
            local_338.m_floats =
                 (cbtScalar  [4])
                 vinsertps_avx(auVar30,ZEXT416((uint)(fVar38 * fVar4 - (fVar9 + fVar3) / fVar17)),
                               0x28);
            pcVar14 = (this->m_cells).m_data[(int)field_id].m_data;
            if (gradient == (cbtVector3 *)0x0) {
              uVar24 = 0;
              shape_function_((cbtShapeMatrix *)&local_228,this_00,&local_338,
                              (cbtShapeGradients *)0x0);
              auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
              bVar27 = false;
              do {
                dVar10 = (this->m_nodes).m_data[(int)field_id].m_data
                         [(int)pcVar14[lVar26].m_cells[uVar24]];
                auVar30._8_8_ = 0;
                auVar30._0_8_ = dVar10;
                if ((dVar10 != 1.79769313486232e+308) || (NAN(dVar10))) {
                  auVar18._8_8_ = 0;
                  auVar18._0_8_ = *(ulong *)(local_228.m_vec[0].m_floats + uVar24 * 2);
                  auVar30 = vfmadd231sd_fma(auVar29._0_16_,auVar30,auVar18);
                  auVar29 = ZEXT1664(auVar30);
                }
                dVar28 = auVar29._0_8_;
                if ((dVar10 == 1.79769313486232e+308) && (!NAN(dVar10))) break;
                bVar27 = 0x1e < uVar24;
                uVar24 = uVar24 + 1;
              } while (uVar24 != 0x20);
              if (!bVar27) {
                return bVar27;
              }
            }
            else {
              shape_function_(&local_328,this_00,&local_338,&local_228);
              gradient->m_floats[0] = 0.0;
              gradient->m_floats[1] = 0.0;
              gradient->m_floats[2] = 0.0;
              gradient->m_floats[3] = 0.0;
              auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
              pcVar22 = local_228.m_vec[0].m_floats + 2;
              uVar24 = 0;
              bVar27 = false;
              do {
                dVar10 = (this->m_nodes).m_data[(int)field_id].m_data
                         [(int)pcVar14[lVar26].m_cells[uVar24]];
                auVar31._8_8_ = 0;
                auVar31._0_8_ = dVar10;
                if ((dVar10 != 1.79769313486232e+308) || (NAN(dVar10))) {
                  auVar11._8_8_ = 0;
                  auVar11._0_8_ = local_328.m_vec[uVar24];
                  auVar30 = vfmadd231sd_fma(auVar29._0_16_,auVar31,auVar11);
                  auVar29 = ZEXT1664(auVar30);
                  auVar32._0_8_ = (double)((cbtVector3 *)(pcVar22 + -2))->m_floats[0];
                  auVar32._8_8_ = in_XMM15_Qb;
                  auVar35._0_8_ = (double)gradient->m_floats[0];
                  auVar35._8_8_ = in_XMM15_Qb;
                  auVar30 = vfmadd231sd_fma(auVar35,auVar31,auVar32);
                  gradient->m_floats[0] = (float)auVar30._0_8_;
                  auVar33._0_8_ = (double)pcVar22[-1];
                  auVar33._8_8_ = in_XMM15_Qb;
                  auVar36._0_8_ = (double)gradient->m_floats[1];
                  auVar36._8_8_ = in_XMM15_Qb;
                  auVar30 = vfmadd231sd_fma(auVar36,auVar31,auVar33);
                  gradient->m_floats[1] = (float)auVar30._0_8_;
                  auVar34._0_8_ = (double)*pcVar22;
                  auVar34._8_8_ = in_XMM15_Qb;
                  auVar37._0_8_ = (double)gradient->m_floats[2];
                  auVar37._8_8_ = in_XMM15_Qb;
                  auVar30 = vfmadd231sd_fma(auVar37,auVar31,auVar34);
                  gradient->m_floats[2] = (float)auVar30._0_8_;
                }
                else {
                  gradient->m_floats[0] = 0.0;
                  gradient->m_floats[1] = 0.0;
                  gradient->m_floats[2] = 0.0;
                  gradient->m_floats[3] = 0.0;
                }
                dVar28 = auVar29._0_8_;
                if ((dVar10 == 1.79769313486232e+308) && (!NAN(dVar10))) break;
                bVar27 = 0x1e < uVar24;
                uVar24 = uVar24 + 1;
                pcVar22 = pcVar22 + 4;
              } while (uVar24 != 0x20);
              if (!bVar27) {
                return bVar27;
              }
              gradient->m_floats[0] = fVar40 * gradient->m_floats[0];
              gradient->m_floats[1] = fVar39 * gradient->m_floats[1];
              gradient->m_floats[2] = fVar38 * gradient->m_floats[2];
            }
            *dist = dVar28;
          }
        }
      }
    }
  }
  else {
    bVar27 = false;
  }
  return bVar27;
}

Assistant:

bool cbtMiniSDF::interpolate(unsigned int field_id, double& dist, cbtVector3 const& x,
							cbtVector3* gradient) const
{
	cbtAssert(m_isValid);
	if (!m_isValid)
		return false;

	if (!m_domain.contains(x))
		return false;

	cbtVector3 tmpmi = ((x - m_domain.min()) * (m_inv_cell_size));  //.cast<unsigned int>().eval();
	unsigned int mi[3] = {(unsigned int)tmpmi[0], (unsigned int)tmpmi[1], (unsigned int)tmpmi[2]};
	if (mi[0] >= m_resolution[0])
		mi[0] = m_resolution[0] - 1;
	if (mi[1] >= m_resolution[1])
		mi[1] = m_resolution[1] - 1;
	if (mi[2] >= m_resolution[2])
		mi[2] = m_resolution[2] - 1;
	cbtMultiIndex mui;
	mui.ijk[0] = mi[0];
	mui.ijk[1] = mi[1];
	mui.ijk[2] = mi[2];
	int i = multiToSingleIndex(mui);
	unsigned int i_ = m_cell_map[field_id][i];
	if (i_ == UINT_MAX)
		return false;

	cbtAlignedBox3d sd = subdomain(i);
	i = i_;
	cbtVector3 d = sd.m_max - sd.m_min;  //.diagonal().eval();

	cbtVector3 denom = (sd.max() - sd.min());
	cbtVector3 c0 = cbtVector3(2.0, 2.0, 2.0) / denom;
	cbtVector3 c1 = (sd.max() + sd.min()) / denom;
	cbtVector3 xi = (c0 * x - c1);

	cbtCell32 const& cell = m_cells[field_id][i];
	if (!gradient)
	{
		//auto phi = m_coefficients[field_id][i].dot(shape_function_(xi, 0));
		double phi = 0.0;
		cbtShapeMatrix N = shape_function_(xi, 0);
		for (unsigned int j = 0u; j < 32u; ++j)
		{
			unsigned int v = cell.m_cells[j];
			double c = m_nodes[field_id][v];
			if (c == DBL_MAX)
			{
				return false;
				;
			}
			phi += c * N[j];
		}

		dist = phi;
		return true;
	}

	cbtShapeGradients dN;
	cbtShapeMatrix N = shape_function_(xi, &dN);

	double phi = 0.0;
	gradient->setZero();
	for (unsigned int j = 0u; j < 32u; ++j)
	{
		unsigned int v = cell.m_cells[j];
		double c = m_nodes[field_id][v];
		if (c == DBL_MAX)
		{
			gradient->setZero();
			return false;
		}
		phi += c * N[j];
		(*gradient)[0] += c * dN(j, 0);
		(*gradient)[1] += c * dN(j, 1);
		(*gradient)[2] += c * dN(j, 2);
	}
	(*gradient) *= c0;
	dist = phi;
	return true;
}